

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_lfdpx(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i64 val;
  uint uVar2;
  uintptr_t o;
  
  if (ctx->fpu_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x30);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    val = tcg_temp_new_i64(tcg_ctx);
    _Var1 = ctx->le_mode;
    gen_qemu_ld64_i64(ctx,val,EA);
    uVar2 = ctx->opcode >> 0x15 & 0x1f;
    if (_Var1 == true) {
      set_fpr(tcg_ctx,uVar2 + 1,val);
      tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
      gen_qemu_ld64_i64(ctx,val,EA);
      uVar2 = ctx->opcode >> 0x15 & 0x1f;
    }
    else {
      set_fpr(tcg_ctx,uVar2,val);
      tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
      gen_qemu_ld64_i64(ctx,val,EA);
      uVar2 = (ctx->opcode >> 0x15 & 0x1f) + 1;
    }
    set_fpr(tcg_ctx,uVar2,val);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_lfdpx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    t0 = tcg_temp_new_i64(tcg_ctx);
    /*
     * We only need to swap high and low halves. gen_qemu_ld64_i64
     * does necessary 64-bit byteswap already.
     */
    if (unlikely(ctx->le_mode)) {
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode) + 1, t0);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    } else {
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode), t0);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode) + 1, t0);
    }
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}